

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

Vec_Int_t * Saig_StrSimPerformMatching_hack(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  Vec_Int_t *p;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vPairs;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  p = Vec_IntAlloc(100);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p0->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_2c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       (((iVar1 = Aig_ObjIsConst1(pObj_00), iVar1 != 0 || (iVar1 = Aig_ObjIsCi(pObj_00), iVar1 != 0)
         ) || (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)))) {
      Vec_IntPush(p,local_2c);
      Vec_IntPush(p,local_2c);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Saig_StrSimPerformMatching_hack( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Int_t * vPairs;
    Aig_Obj_t * pObj;
    int i;
    // create array of pairs
    vPairs = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( p0, pObj, i )
    {
        if ( !Aig_ObjIsConst1(pObj) && !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        Vec_IntPush( vPairs, i );
        Vec_IntPush( vPairs, i );
    }
    return vPairs;
}